

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

int vkt::tessellation::getClampedRoundedTessLevel(SpacingMode mode,float tessLevel)

{
  int iVar1;
  float clampedTessLevel;
  
  clampedTessLevel = getClampedTessLevel(mode,tessLevel);
  iVar1 = getRoundedTessLevel(mode,clampedTessLevel);
  return iVar1;
}

Assistant:

int getClampedRoundedTessLevel (const SpacingMode mode, const float tessLevel)
{
	return getRoundedTessLevel(mode, getClampedTessLevel(mode, tessLevel));
}